

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui4.cpp
# Opt level: O0

ssize_t __thiscall DomString::write(DomString *this,int __fd,void *__buf,size_t __n)

{
  bool bVar1;
  undefined4 in_register_00000034;
  QAnyStringView *str_00;
  long in_FS_OFFSET;
  char16_t *str;
  DomString *in_stack_fffffffffffffdf8;
  QArrayDataPointer<char16_t> *in_stack_fffffffffffffe00;
  QAnyStringView *pQVar2;
  QAnyStringView *in_stack_fffffffffffffe08;
  QAnyStringView *in_stack_fffffffffffffe10;
  QAnyStringView *in_stack_fffffffffffffe18;
  QAnyStringView *local_148;
  QAnyStringView *local_f8;
  QAnyStringView *local_a8;
  QAnyStringView *local_58;
  QArrayDataPointer<char16_t> local_48 [2];
  long local_8;
  
  str_00 = (QAnyStringView *)CONCAT44(in_register_00000034,__fd);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QString::isEmpty((QString *)0x1c0829);
  if (bVar1) {
    QArrayDataPointer<char16_t>::QArrayDataPointer(local_48,(Data *)0x0,L"string",6);
    QString::QString((QString *)in_stack_fffffffffffffe00,(DataPointer *)in_stack_fffffffffffffdf8);
  }
  else {
    QString::toLower(&in_stack_fffffffffffffdf8->m_text);
  }
  QAnyStringView::QAnyStringView(in_stack_fffffffffffffe10,(QString *)in_stack_fffffffffffffe08);
  QXmlStreamWriter::writeStartElement((QAnyStringView *)str_00);
  QString::~QString((QString *)0x1c08dc);
  if (bVar1) {
    QArrayDataPointer<char16_t>::~QArrayDataPointer(in_stack_fffffffffffffe00);
  }
  bVar1 = hasAttributeNotr(this);
  if (bVar1) {
    in_stack_fffffffffffffe18 = str_00;
    Qt::Literals::StringLiterals::operator____s
              ((char16_t *)str_00,(size_t)in_stack_fffffffffffffe10);
    QAnyStringView::QAnyStringView(in_stack_fffffffffffffe10,(QString *)in_stack_fffffffffffffe08);
    attributeNotr(in_stack_fffffffffffffdf8);
    QAnyStringView::QAnyStringView(in_stack_fffffffffffffe10,(QString *)in_stack_fffffffffffffe08);
    QXmlStreamWriter::writeAttribute((QAnyStringView *)in_stack_fffffffffffffe18,local_58);
    QString::~QString((QString *)0x1c099b);
    QString::~QString((QString *)0x1c09a8);
  }
  bVar1 = hasAttributeComment(this);
  if (bVar1) {
    in_stack_fffffffffffffe10 = str_00;
    Qt::Literals::StringLiterals::operator____s
              ((char16_t *)in_stack_fffffffffffffe18,(size_t)str_00);
    QAnyStringView::QAnyStringView(in_stack_fffffffffffffe10,(QString *)in_stack_fffffffffffffe08);
    attributeComment(in_stack_fffffffffffffdf8);
    QAnyStringView::QAnyStringView(in_stack_fffffffffffffe10,(QString *)in_stack_fffffffffffffe08);
    QXmlStreamWriter::writeAttribute((QAnyStringView *)in_stack_fffffffffffffe10,local_a8);
    QString::~QString((QString *)0x1c0a51);
    QString::~QString((QString *)0x1c0a5e);
  }
  bVar1 = hasAttributeExtraComment(this);
  if (bVar1) {
    in_stack_fffffffffffffe08 = str_00;
    Qt::Literals::StringLiterals::operator____s
              ((char16_t *)in_stack_fffffffffffffe18,(size_t)in_stack_fffffffffffffe10);
    QAnyStringView::QAnyStringView(in_stack_fffffffffffffe10,(QString *)in_stack_fffffffffffffe08);
    attributeExtraComment(in_stack_fffffffffffffdf8);
    QAnyStringView::QAnyStringView(in_stack_fffffffffffffe10,(QString *)in_stack_fffffffffffffe08);
    QXmlStreamWriter::writeAttribute((QAnyStringView *)in_stack_fffffffffffffe08,local_f8);
    QString::~QString((QString *)0x1c0b07);
    QString::~QString((QString *)0x1c0b14);
  }
  bVar1 = hasAttributeId(this);
  if (bVar1) {
    pQVar2 = str_00;
    Qt::Literals::StringLiterals::operator____s
              ((char16_t *)in_stack_fffffffffffffe18,(size_t)in_stack_fffffffffffffe10);
    QAnyStringView::QAnyStringView(in_stack_fffffffffffffe10,(QString *)in_stack_fffffffffffffe08);
    attributeId(in_stack_fffffffffffffdf8);
    QAnyStringView::QAnyStringView(in_stack_fffffffffffffe10,(QString *)in_stack_fffffffffffffe08);
    QXmlStreamWriter::writeAttribute((QAnyStringView *)pQVar2,local_148);
    QString::~QString((QString *)0x1c0bbd);
    QString::~QString((QString *)0x1c0bca);
  }
  bVar1 = QString::isEmpty((QString *)0x1c0bd4);
  if (!bVar1) {
    QAnyStringView::QAnyStringView(in_stack_fffffffffffffe10,(QString *)in_stack_fffffffffffffe08);
    QXmlStreamWriter::writeCharacters((QAnyStringView *)str_00);
  }
  QXmlStreamWriter::writeEndElement();
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return *(long *)(in_FS_OFFSET + 0x28);
}

Assistant:

void DomString::write(QXmlStreamWriter &writer, const QString &tagName) const
{
    writer.writeStartElement(tagName.isEmpty() ? QStringLiteral("string") : tagName.toLower());

    if (hasAttributeNotr())
        writer.writeAttribute(u"notr"_s, attributeNotr());

    if (hasAttributeComment())
        writer.writeAttribute(u"comment"_s, attributeComment());

    if (hasAttributeExtraComment())
        writer.writeAttribute(u"extracomment"_s, attributeExtraComment());

    if (hasAttributeId())
        writer.writeAttribute(u"id"_s, attributeId());

    if (!m_text.isEmpty())
        writer.writeCharacters(m_text);

    writer.writeEndElement();
}